

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<char>::relocate(QArrayDataPointer<char> *this,qsizetype offset,char **data)

{
  char *__src;
  char *pcVar1;
  
  __src = this->ptr;
  if ((this->size != 0) && (__src != (char *)0x0 && offset != 0)) {
    memmove(__src + offset,__src,this->size);
  }
  if (data != (char **)0x0) {
    pcVar1 = *data;
    if ((this->ptr <= pcVar1) && (pcVar1 < this->ptr + this->size)) {
      *data = pcVar1 + offset;
    }
  }
  this->ptr = __src + offset;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }